

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wait_strategy.h
# Opt level: O0

int64_t __thiscall
disruptor::SleepingStrategy<200l,std::chrono::duration<long,std::ratio<1l,1000l>>,1>::
WaitFor<long,std::ratio<1l,1l>>
          (SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1> *this,
          int64_t *sequence,Sequence *cursor,
          vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *dependents,
          atomic<bool> *alerted,duration<long,_std::ratio<1L,_1L>_> *timeout)

{
  bool bVar1;
  long *in_RSI;
  Sequence *in_RDI;
  function<long_()> min_sequence;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  stop;
  time_point start;
  int64_t counter;
  int64_t available_sequence;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  memory_order in_stack_ffffffffffffff54;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffff58;
  vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *in_stack_ffffffffffffff60;
  SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1> *local_8;
  
  std::chrono::_V2::system_clock::now();
  std::chrono::operator+
            (in_stack_ffffffffffffff58,
             (duration<long,_std::ratio<1L,_1L>_> *)
             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  buildMinSequenceFunction(in_RDI,in_stack_ffffffffffffff60);
  do {
    local_8 = (SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1> *)
              std::function<long_()>::operator()
                        ((function<long_()> *)
                         CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    if (*in_RSI <= (long)local_8) goto LAB_0012fae4;
    bVar1 = std::atomic<bool>::load
                      ((atomic<bool> *)in_stack_ffffffffffffff58,in_stack_ffffffffffffff54);
    if (bVar1) {
      local_8 = (SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1> *)
                0xfffffffffffffffe;
      goto LAB_0012fae4;
    }
    in_stack_ffffffffffffff58 =
         (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
          *)SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1>::
            ApplyWaitMethod(local_8,(int64_t)in_stack_ffffffffffffff58);
    std::chrono::_V2::system_clock::now();
    bVar1 = std::chrono::operator<=
                      ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                       in_stack_ffffffffffffff48);
    in_stack_ffffffffffffff54 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff54);
  } while (!bVar1);
  local_8 = (SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1> *)
            0xfffffffffffffffd;
LAB_0012fae4:
  std::function<long_()>::~function((function<long_()> *)0x12faee);
  return (int64_t)local_8;
}

Assistant:

int64_t WaitFor(const int64_t& sequence, const Sequence& cursor,
                  const std::vector<Sequence*>& dependents,
                  const std::atomic<bool>& alerted,
                  const std::chrono::duration<R, P>& timeout) {
    int64_t available_sequence = kInitialCursorValue;
    int64_t counter = S;

    const auto start = std::chrono::system_clock::now();
    const auto stop = start + timeout;
    const auto min_sequence = buildMinSequenceFunction(cursor, dependents);

    while ((available_sequence = min_sequence()) < sequence) {
      if (alerted.load()) return kAlertedSignal;

      counter = ApplyWaitMethod(counter);

      if (stop <= std::chrono::system_clock::now()) return kTimeoutSignal;
    }

    return available_sequence;
  }